

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void int_rel(IntVar *x,IntRelType t,int c)

{
  char cVar1;
  IRR local_28;
  int iVar2;
  
  switch(t) {
  case IRT_EQ:
    if (((x->min).v == c) && ((x->max).v == c)) {
      return;
    }
    iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0x10])(x,(long)c,0,1);
    cVar1 = (char)iVar2;
    goto LAB_0018f052;
  case IRT_NE:
    local_28.r.s = bv_true.s;
    local_28.r.v = bv_true.v;
    local_28.t = IRT_NE;
    local_28.r.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_28.x = x;
    local_28.c = c;
    vec<IRR>::push(&ircs,&local_28);
    return;
  case IRT_LE:
    if ((x->max).v <= c) {
      return;
    }
    break;
  case IRT_LT:
    if ((x->max).v < c) {
      return;
    }
    c = c + -1;
    break;
  case IRT_GE:
    if (c <= (x->min).v) {
      return;
    }
    goto LAB_0018f044;
  case IRT_GT:
    if (c < (x->min).v) {
      return;
    }
    c = c + 1;
LAB_0018f044:
    iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0xe])(x,(long)c,0,1);
    cVar1 = (char)iVar2;
    goto LAB_0018f052;
  default:
    fprintf(_stderr,"%s:%d: ","binary.cpp",0x16b);
    fwrite("Assertion failed.\n",0x12,1,_stderr);
    abort();
  }
  iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0xf])(x,(long)c,0,1);
  cVar1 = (char)iVar2;
LAB_0018f052:
  if (cVar1 != '\0') {
    return;
  }
  puts("=====UNSATISFIABLE=====");
  printf("%% Top level failure!\n");
  exit(0);
}

Assistant:

void int_rel(IntVar* x, IntRelType t, int c) {
	switch (t) {
		case IRT_EQ:
			TL_SET(x, setVal, c);
			break;
		case IRT_NE:
			ircs.push(IRR(x, t, c, bv_true));
			break;
		case IRT_LE:
			TL_SET(x, setMax, c);
			break;
		case IRT_LT:
			TL_SET(x, setMax, c - 1);
			break;
		case IRT_GE:
			TL_SET(x, setMin, c);
			break;
		case IRT_GT:
			TL_SET(x, setMin, c + 1);
			break;
		default:
			NEVER;
	}
}